

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_samtools.c
# Opt level: O3

int bam_construct_seq(bam_seq_t **bp,size_t extra_len,char *qname,size_t qname_len,int flag,
                     int rname,int pos,int end,int mapq,uint32_t ncigar,uint32_t *cigar,int mrnm,
                     int mpos,int isize,int len,char *seq,char *qual)

{
  bam_seq_t *pbVar1;
  byte bVar2;
  uint8_t *puVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  size_t __n;
  int iVar9;
  undefined2 local_4c;
  
  pbVar1 = *bp;
  iVar8 = (int)(qname_len + 1);
  iVar9 = (int)extra_len + iVar8 + ncigar * 4 + len + ((len - (len + 1 >> 0x1f)) + 1 >> 1);
  if (pbVar1->m_data < iVar9) {
    uVar4 = (int)(iVar9 - 1U) >> 1 | iVar9 - 1U;
    uVar4 = (int)uVar4 >> 2 | uVar4;
    uVar4 = (int)uVar4 >> 4 | uVar4;
    uVar4 = (int)uVar4 >> 8 | uVar4;
    iVar5 = ((int)uVar4 >> 0x10 | uVar4) + 1;
    pbVar1->m_data = iVar5;
    puVar3 = (uint8_t *)realloc(pbVar1->data,(long)iVar5);
    pbVar1->data = puVar3;
    if (puVar3 == (uint8_t *)0x0) {
      return -1;
    }
  }
  __n = (size_t)len;
  pbVar1->l_data = iVar9;
  (pbVar1->core).tid = rname;
  (pbVar1->core).pos = pos + -1;
  iVar9 = 0x1249;
  bVar2 = 0xe;
  uVar4 = 6;
  bVar6 = 0xc;
  do {
    lVar7 = (long)pos >> (bVar2 & 0x3f);
    if (lVar7 == (long)end + -1 >> (bVar2 & 0x3f)) {
      uVar4 = iVar9 + (int)lVar7 & 0xffff;
      goto LAB_00154b0a;
    }
    bVar2 = bVar2 + 3;
    iVar9 = iVar9 + (-1 << (bVar6 & 0x1f));
    uVar4 = uVar4 - 1;
    bVar6 = bVar6 - 3;
  } while (1 < uVar4);
  uVar4 = 0;
LAB_00154b0a:
  local_4c = (undefined2)flag;
  *(ulong *)&(pbVar1->core).field_0x8 =
       (ulong)ncigar << 0x30 |
       (ulong)CONCAT24(local_4c,(mapq & 0xffU) << 0x10 | uVar4 | iVar8 << 0x18);
  (pbVar1->core).l_qseq = len;
  (pbVar1->core).mtid = mrnm;
  (pbVar1->core).mpos = mpos + -1;
  (pbVar1->core).isize = isize;
  puVar3 = pbVar1->data;
  strncpy((char *)puVar3,qname,qname_len);
  puVar3[qname_len] = '\0';
  memcpy(puVar3 + qname_len + 1,cigar,(ulong)(ncigar * 4));
  puVar3 = puVar3 + qname_len + 1 + ncigar * 4;
  uVar4 = 0;
  if (1 < len) {
    lVar7 = 1;
    do {
      *puVar3 = "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
                [(byte)seq[lVar7 + -1]] * '\x10' +
                "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
                [(byte)seq[lVar7]];
      puVar3 = puVar3 + 1;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)__n);
    uVar4 = (int)lVar7 - 1;
  }
  if ((int)uVar4 < len) {
    *puVar3 = "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
              [(byte)seq[uVar4]] << 4;
    puVar3 = puVar3 + 1;
  }
  if (qual == (char *)0x0) {
    memset(puVar3,0xff,__n);
  }
  else {
    memcpy(puVar3,qual,__n);
  }
  return 0;
}

Assistant:

int bam_construct_seq(bam_seq_t **bp, size_t extra_len,
		      const char *qname, size_t qname_len,
		      int flag,
		      int rname,      // Ref ID
		      int pos,
		      int end,        // aligned start/end coords
		      int mapq,
		      uint32_t ncigar, const uint32_t *cigar,
		      int mrnm,       // Mate Ref ID
		      int mpos,
		      int isize,
		      int len,
		      const char *seq,
		      const char *qual) {
    static const char L[256] = {
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15, 0,15,15,
	15, 1,14, 2,13,15,15, 4,11,15,15,12,15, 3,15,15,
	15,15, 5, 6, 8,15, 7, 9,15,10,15,15,15,15,15,15,
	15, 1,14, 2,13,15,15, 4,11,15,15,12,15, 3,15,15,
	15,15, 5, 6, 8,15, 7, 9,15,10,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,
	15,15,15,15,15,15,15,15,15,15,15,15,15,15,15,15
    };
    bam1_t *b = (bam1_t *)*bp;
    uint8_t *cp;
    int i, bam_len;

    //b->l_aux = extra_len; // we fill this out later

    bam_len = qname_len + 1 + ncigar*4 + (len+1)/2 + len + extra_len;
    if (b->m_data < bam_len) {
	b->m_data = bam_len;
	kroundup32(b->m_data);
	b->data = (uint8_t*)realloc(b->data, b->m_data);
	if (!b->data)
	    return -1;
    }
    b->l_data = bam_len;

    b->core.tid     = rname;
    b->core.pos     = pos-1;
    b->core.bin     = bam_reg2bin(pos, end);
    b->core.qual    = mapq;
    b->core.l_qname = qname_len+1;
    b->core.flag    = flag;
    b->core.n_cigar = ncigar;
    b->core.l_qseq  = len;
    b->core.mtid    = mrnm;
    b->core.mpos    = mpos-1;
    b->core.isize   = isize;

    cp = b->data;

    strncpy((char *)cp, qname, qname_len);
    cp[qname_len] = 0;
    cp += qname_len+1;
    memcpy(cp, cigar, ncigar*4);
    cp += ncigar*4;

    for (i = 0; i+1 < len; i+=2) {
	*cp++ = (L[(uc)seq[i]]<<4) + L[(uc)seq[i+1]];
    }
    if (i < len)
	*cp++ = L[(uc)seq[i]]<<4;

    if (qual)
	memcpy(cp, qual, len);
    else
	memset(cp, '\xff', len);

    return 0;
}